

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter_index_tests.cpp
# Opt level: O0

void __thiscall
blockfilter_index_tests::blockfilter_index_init_destroy::test_method
          (blockfilter_index_init_destroy *this)

{
  bool bVar1;
  lazy_ostream *plVar2;
  long in_FS_OFFSET;
  BlockFilterIndex *filter_index;
  int iter_count;
  char *in_stack_fffffffffffff858;
  lazy_ostream *in_stack_fffffffffffff860;
  function<void_(BlockFilterIndex_&)> *in_stack_fffffffffffff868;
  BlockFilterType in_stack_fffffffffffff87f;
  const_string *in_stack_fffffffffffff880;
  function<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_()> *pfVar3;
  size_t in_stack_fffffffffffff888;
  undefined1 *puVar4;
  const_string *in_stack_fffffffffffff890;
  const_string *file;
  lazy_ostream *in_stack_fffffffffffff898;
  function<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_()>
  *in_stack_fffffffffffff8a8;
  undefined8 in_stack_fffffffffffff8f8;
  size_t in_stack_fffffffffffff900;
  undefined1 *n_cache_size;
  undefined8 in_stack_fffffffffffff908;
  const_string local_5b8 [2];
  lazy_ostream local_598 [2];
  assertion_result local_578;
  const_string local_560;
  undefined1 local_550 [16];
  const_string local_540 [2];
  lazy_ostream local_520 [4];
  assertion_result local_4d8 [2];
  const_string local_4a0 [2];
  lazy_ostream local_480 [2];
  assertion_result local_460 [2];
  const_string local_428 [2];
  lazy_ostream local_408 [2];
  assertion_result local_3e8;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  const_string local_3b0 [2];
  lazy_ostream local_390 [2];
  assertion_result local_370 [2];
  lazy_ostream local_334;
  undefined1 local_320 [64];
  undefined4 *local_2e0;
  undefined4 local_2b4;
  const_string local_2b0 [2];
  lazy_ostream local_290 [4];
  assertion_result local_248 [2];
  const_string local_210 [2];
  lazy_ostream local_1f0 [2];
  assertion_result local_1d0 [2];
  const_string local_198 [2];
  lazy_ostream local_178 [2];
  assertion_result local_158 [2];
  const_string local_120 [2];
  lazy_ostream local_100 [4];
  assertion_result local_b8 [2];
  const_string local_80 [2];
  lazy_ostream local_60 [2];
  assertion_result local_40 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  GetBlockFilterIndex(in_stack_fffffffffffff87f);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868,
               (pointer)in_stack_fffffffffffff860,(unsigned_long)in_stack_fffffffffffff858);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff858);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff898,in_stack_fffffffffffff890,
               in_stack_fffffffffffff888,in_stack_fffffffffffff880);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff868,
               SUB81((ulong)in_stack_fffffffffffff860 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868,
               (pointer)in_stack_fffffffffffff860,(unsigned_long)in_stack_fffffffffffff858);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff860,(basic_cstring<const_char> *)in_stack_fffffffffffff858);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868,
               (pointer)in_stack_fffffffffffff860,(unsigned_long)in_stack_fffffffffffff858);
    in_stack_fffffffffffff858 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_40,local_60,local_80,0x116,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff858);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff858);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868,
               (pointer)in_stack_fffffffffffff860,(unsigned_long)in_stack_fffffffffffff858);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff858);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff898,in_stack_fffffffffffff890,
               in_stack_fffffffffffff888,in_stack_fffffffffffff880);
    std::function<std::unique_ptr<interfaces::Chain,std::default_delete<interfaces::Chain>>()>::
    function<blockfilter_index_tests::blockfilter_index_init_destroy::test_method()::__0,void>
              ((function<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_()>
                *)in_stack_fffffffffffff868,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffff860);
    InitBlockFilterIndex
              (in_stack_fffffffffffff8a8,(BlockFilterType)((ulong)in_stack_fffffffffffff908 >> 0x38)
               ,in_stack_fffffffffffff900,SUB81((ulong)in_stack_fffffffffffff8f8 >> 0x38,0),
               SUB81((ulong)in_stack_fffffffffffff8f8 >> 0x30,0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff868,
               SUB81((ulong)in_stack_fffffffffffff860 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868,
               (pointer)in_stack_fffffffffffff860,(unsigned_long)in_stack_fffffffffffff858);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff860,(basic_cstring<const_char> *)in_stack_fffffffffffff858);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868,
               (pointer)in_stack_fffffffffffff860,(unsigned_long)in_stack_fffffffffffff858);
    in_stack_fffffffffffff858 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b8,local_100,local_120,0x118,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff858);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff858);
    std::function<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_()>::
    ~function((function<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_()>
               *)in_stack_fffffffffffff858);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  GetBlockFilterIndex(in_stack_fffffffffffff87f);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868,
               (pointer)in_stack_fffffffffffff860,(unsigned_long)in_stack_fffffffffffff858);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff858);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff898,in_stack_fffffffffffff890,
               in_stack_fffffffffffff888,in_stack_fffffffffffff880);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff868,
               SUB81((ulong)in_stack_fffffffffffff860 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868,
               (pointer)in_stack_fffffffffffff860,(unsigned_long)in_stack_fffffffffffff858);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff860,(basic_cstring<const_char> *)in_stack_fffffffffffff858);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868,
               (pointer)in_stack_fffffffffffff860,(unsigned_long)in_stack_fffffffffffff858);
    in_stack_fffffffffffff858 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_158,local_178,local_198,0x11b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff858);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff858);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868,
               (pointer)in_stack_fffffffffffff860,(unsigned_long)in_stack_fffffffffffff858);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff858);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff898,in_stack_fffffffffffff890,
               in_stack_fffffffffffff888,in_stack_fffffffffffff880);
    BlockFilterIndex::GetFilterType((BlockFilterIndex *)in_stack_fffffffffffff858);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff868,
               SUB81((ulong)in_stack_fffffffffffff860 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868,
               (pointer)in_stack_fffffffffffff860,(unsigned_long)in_stack_fffffffffffff858);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff860,(basic_cstring<const_char> *)in_stack_fffffffffffff858);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868,
               (pointer)in_stack_fffffffffffff860,(unsigned_long)in_stack_fffffffffffff858);
    in_stack_fffffffffffff858 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1d0,local_1f0,local_210,0x11c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff858);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff858);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868,
               (pointer)in_stack_fffffffffffff860,(unsigned_long)in_stack_fffffffffffff858);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff858);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff898,in_stack_fffffffffffff890,
               in_stack_fffffffffffff888,in_stack_fffffffffffff880);
    std::function<std::unique_ptr<interfaces::Chain,std::default_delete<interfaces::Chain>>()>::
    function<blockfilter_index_tests::blockfilter_index_init_destroy::test_method()::__1,void>
              ((function<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_()>
                *)in_stack_fffffffffffff868,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffff860);
    InitBlockFilterIndex
              (in_stack_fffffffffffff8a8,(BlockFilterType)((ulong)in_stack_fffffffffffff908 >> 0x38)
               ,in_stack_fffffffffffff900,SUB81((ulong)in_stack_fffffffffffff8f8 >> 0x38,0),
               SUB81((ulong)in_stack_fffffffffffff8f8 >> 0x30,0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff868,
               SUB81((ulong)in_stack_fffffffffffff860 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868,
               (pointer)in_stack_fffffffffffff860,(unsigned_long)in_stack_fffffffffffff858);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff860,(basic_cstring<const_char> *)in_stack_fffffffffffff858);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868,
               (pointer)in_stack_fffffffffffff860,(unsigned_long)in_stack_fffffffffffff858);
    in_stack_fffffffffffff858 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_248,local_290,local_2b0,0x11f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff858);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff858);
    std::function<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_()>::
    ~function((function<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_()>
               *)in_stack_fffffffffffff858);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_2b4 = 0;
  local_2e0 = &local_2b4;
  std::function<void(BlockFilterIndex&)>::
  function<blockfilter_index_tests::blockfilter_index_init_destroy::test_method()::__2,void>
            (in_stack_fffffffffffff868,(anon_class_8_1_30bac6e6 *)in_stack_fffffffffffff860);
  ForEachBlockFilterIndex(in_stack_fffffffffffff868);
  std::function<void_(BlockFilterIndex_&)>::~function
            ((function<void_(BlockFilterIndex_&)> *)in_stack_fffffffffffff858);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868,
               (pointer)in_stack_fffffffffffff860,(unsigned_long)in_stack_fffffffffffff858);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff858);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff898,in_stack_fffffffffffff890,
               in_stack_fffffffffffff888,in_stack_fffffffffffff880);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff860,(char (*) [1])in_stack_fffffffffffff858);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868,
               (pointer)in_stack_fffffffffffff860,(unsigned_long)in_stack_fffffffffffff858);
    local_334._vptr_lazy_ostream._0_4_ = 1;
    in_stack_fffffffffffff868 = (function<void_(BlockFilterIndex_&)> *)0x1ccb7e1;
    in_stack_fffffffffffff860 = &local_334;
    in_stack_fffffffffffff858 = "iter_count";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_320,(undefined1 *)((long)&local_334._vptr_lazy_ostream + 4),0x123,1,2,
               &local_2b4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff858);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868,
               (pointer)in_stack_fffffffffffff860,(unsigned_long)in_stack_fffffffffffff858);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff858);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff898,in_stack_fffffffffffff890,
               in_stack_fffffffffffff888,in_stack_fffffffffffff880);
    DestroyBlockFilterIndex((BlockFilterType)((ulong)in_stack_fffffffffffff858 >> 0x38));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff868,
               SUB81((ulong)in_stack_fffffffffffff860 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868,
               (pointer)in_stack_fffffffffffff860,(unsigned_long)in_stack_fffffffffffff858);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff860,(basic_cstring<const_char> *)in_stack_fffffffffffff858);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868,
               (pointer)in_stack_fffffffffffff860,(unsigned_long)in_stack_fffffffffffff858);
    in_stack_fffffffffffff858 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_370,local_390,local_3b0,0x125,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff858);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff858);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    puVar4 = local_3c0;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868,
               (pointer)in_stack_fffffffffffff860,(unsigned_long)in_stack_fffffffffffff858);
    n_cache_size = local_3d0;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff858);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff898,in_stack_fffffffffffff890,
               in_stack_fffffffffffff888,in_stack_fffffffffffff880);
    DestroyBlockFilterIndex((BlockFilterType)((ulong)in_stack_fffffffffffff858 >> 0x38));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff868,
               SUB81((ulong)in_stack_fffffffffffff860 >> 0x38,0));
    plVar2 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868,
               (pointer)in_stack_fffffffffffff860,(unsigned_long)in_stack_fffffffffffff858);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff860,(basic_cstring<const_char> *)in_stack_fffffffffffff858);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868,
               (pointer)in_stack_fffffffffffff860,(unsigned_long)in_stack_fffffffffffff858);
    in_stack_fffffffffffff858 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_3e8,local_408,local_428,0x128,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff858);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff858);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  GetBlockFilterIndex(in_stack_fffffffffffff87f);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868,
               (pointer)in_stack_fffffffffffff860,(unsigned_long)in_stack_fffffffffffff858);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff858);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff898,in_stack_fffffffffffff890,
               in_stack_fffffffffffff888,in_stack_fffffffffffff880);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff868,
               SUB81((ulong)in_stack_fffffffffffff860 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868,
               (pointer)in_stack_fffffffffffff860,(unsigned_long)in_stack_fffffffffffff858);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff860,(basic_cstring<const_char> *)in_stack_fffffffffffff858);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868,
               (pointer)in_stack_fffffffffffff860,(unsigned_long)in_stack_fffffffffffff858);
    in_stack_fffffffffffff858 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_460,local_480,local_4a0,299,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff858);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff858);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    pfVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868,
               (pointer)in_stack_fffffffffffff860,(unsigned_long)in_stack_fffffffffffff858);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff858);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff898,in_stack_fffffffffffff890,
               in_stack_fffffffffffff888,in_stack_fffffffffffff880);
    std::function<std::unique_ptr<interfaces::Chain,std::default_delete<interfaces::Chain>>()>::
    function<blockfilter_index_tests::blockfilter_index_init_destroy::test_method()::__3,void>
              ((function<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_()>
                *)in_stack_fffffffffffff868,(anon_class_8_1_8991fb9c *)in_stack_fffffffffffff860);
    InitBlockFilterIndex
              (pfVar3,(BlockFilterType)((ulong)plVar2 >> 0x38),(size_t)n_cache_size,
               SUB81((ulong)puVar4 >> 0x38,0),SUB81((ulong)puVar4 >> 0x30,0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff868,
               SUB81((ulong)in_stack_fffffffffffff860 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868,
               (pointer)in_stack_fffffffffffff860,(unsigned_long)in_stack_fffffffffffff858);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff860,(basic_cstring<const_char> *)in_stack_fffffffffffff858);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868,
               (pointer)in_stack_fffffffffffff860,(unsigned_long)in_stack_fffffffffffff858);
    in_stack_fffffffffffff858 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4d8,local_520,local_540,0x12e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff858);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff858);
    std::function<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_()>::
    ~function((function<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_()>
               *)in_stack_fffffffffffff858);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  DestroyAllBlockFilterIndexes();
  GetBlockFilterIndex(in_stack_fffffffffffff87f);
  do {
    puVar4 = local_550;
    pfVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868,
               (pointer)in_stack_fffffffffffff860,(unsigned_long)in_stack_fffffffffffff858);
    file = &local_560;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff858);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff898,file,(size_t)puVar4,
               (const_string *)pfVar3);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff868,
               SUB81((ulong)in_stack_fffffffffffff860 >> 0x38,0));
    in_stack_fffffffffffff898 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868,
               (pointer)in_stack_fffffffffffff860,(unsigned_long)in_stack_fffffffffffff858);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff860,(basic_cstring<const_char> *)in_stack_fffffffffffff858);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff868,
               (pointer)in_stack_fffffffffffff860,(unsigned_long)in_stack_fffffffffffff858);
    in_stack_fffffffffffff858 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_578,local_598,local_5b8,0x133,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff858);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff858);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(blockfilter_index_init_destroy, BasicTestingSetup)
{
    BlockFilterIndex* filter_index;

    filter_index = GetBlockFilterIndex(BlockFilterType::BASIC);
    BOOST_CHECK(filter_index == nullptr);

    BOOST_CHECK(InitBlockFilterIndex([&]{ return interfaces::MakeChain(m_node); }, BlockFilterType::BASIC, 1 << 20, true, false));

    filter_index = GetBlockFilterIndex(BlockFilterType::BASIC);
    BOOST_CHECK(filter_index != nullptr);
    BOOST_CHECK(filter_index->GetFilterType() == BlockFilterType::BASIC);

    // Initialize returns false if index already exists.
    BOOST_CHECK(!InitBlockFilterIndex([&]{ return interfaces::MakeChain(m_node); }, BlockFilterType::BASIC, 1 << 20, true, false));

    int iter_count = 0;
    ForEachBlockFilterIndex([&iter_count](BlockFilterIndex& _index) { iter_count++; });
    BOOST_CHECK_EQUAL(iter_count, 1);

    BOOST_CHECK(DestroyBlockFilterIndex(BlockFilterType::BASIC));

    // Destroy returns false because index was already destroyed.
    BOOST_CHECK(!DestroyBlockFilterIndex(BlockFilterType::BASIC));

    filter_index = GetBlockFilterIndex(BlockFilterType::BASIC);
    BOOST_CHECK(filter_index == nullptr);

    // Reinitialize index.
    BOOST_CHECK(InitBlockFilterIndex([&]{ return interfaces::MakeChain(m_node); }, BlockFilterType::BASIC, 1 << 20, true, false));

    DestroyAllBlockFilterIndexes();

    filter_index = GetBlockFilterIndex(BlockFilterType::BASIC);
    BOOST_CHECK(filter_index == nullptr);
}